

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerContainer.h
# Opt level: O2

void crampl::
     ContainerContainer<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>_>
     ::sizeCheck(tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<double,_std::allocator<double>_>_&>
                 *containers)

{
  runtime_error *this;
  bool result;
  optional<unsigned_long> firstSize;
  
  firstSize.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  result = true;
  crampl::detail::
  for_each_in_tuple_impl<crampl::ContainerContainer<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>>::sizeCheck(std::tuple<std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&>)::_lambda(auto:1_const&)_1_,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,0ul,1ul>
            (containers,&firstSize,&result);
  if (result != false) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid container sizes");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void sizeCheck(std::tuple<Containers&...> containers) {
        std::optional<std::size_t> firstSize{};
        bool result = true;
        detail::for_each_in_tuple(containers, [&](const auto &c) {
            if (firstSize)
                result &= *firstSize == c.size();
            else
                firstSize = c.size();
        });
        if (!result)
            throw std::runtime_error("invalid container sizes");
    }